

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

Aig_Man_t * Cgt_ManDeriveAigForGating(Cgt_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar7;
  int iVar8;
  Aig_Man_t *pAVar9;
  
  if (p->pAig->nRegs != 0) {
    p_00 = Aig_ManStart(p->pAig->vObjs->nSize);
    pcVar2 = Abc_UtilStrsav("CG_miter");
    p_00->pName = pcVar2;
    p->pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
    iVar8 = 0;
    while( true ) {
      pAVar9 = p->pAig;
      if (pAVar9->vCis->nSize <= iVar8) break;
      pvVar3 = Vec_PtrEntry(pAVar9->vCis,iVar8);
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    while( true ) {
      iVar1 = pAVar9->vObjs->nSize;
      if (iVar1 <= iVar8) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar9->vObjs,iVar8);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        pAVar6 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p_00,pAVar5,pAVar6);
        (pAVar4->field_5).pData = pAVar5;
      }
      iVar8 = iVar8 + 1;
      pAVar9 = p->pAig;
    }
    if (p->pPars->nOdcMax < 1) {
      for (iVar8 = 0; iVar8 < pAVar9->nRegs; iVar8 = iVar8 + 1) {
        pAVar5 = Saig_ManLi(pAVar9,iVar8);
        pAVar4 = Saig_ManLo(p->pAig,iVar8);
        pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        pAVar4 = Aig_Exor(p_00,pAVar4,pAVar6);
        pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
        (pAVar5->field_5).pData = pAVar4;
        pAVar9 = p->pAig;
      }
    }
    else {
      p_01 = Vec_PtrStart(iVar1);
      p_02 = Vec_PtrStart(p->pAig->vObjs->nSize);
      iVar8 = 0;
      while( true ) {
        pAVar9 = p->pAig;
        iVar1 = pAVar9->nRegs;
        if (iVar1 <= iVar8) break;
        pAVar4 = Saig_ManLi(pAVar9,iVar8);
        pAVar5 = Saig_ManLo(p->pAig,iVar8);
        iVar1 = pAVar5->Id;
        pAVar6 = Aig_ObjChild0Copy(pAVar4);
        Vec_PtrWriteEntry(p_01,iVar1,pAVar6);
        iVar1 = pAVar5->Id;
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Vec_PtrWriteEntry(p_02,iVar1,pAVar4);
        iVar8 = iVar8 + 1;
      }
      for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
        pAVar5 = Saig_ManLi(pAVar9,iVar8);
        pAVar4 = Saig_ManLo(p->pAig,iVar8);
        Vec_PtrWriteEntry(p_01,pAVar4->Id,(void *)((ulong)p_00->pConst1 ^ 1));
        Vec_PtrWriteEntry(p_02,pAVar4->Id,p_00->pConst1);
        pAVar6 = Cgt_ManConstructCareCondition(p,p_00,pAVar4,p_01,p_02);
        iVar1 = pAVar4->Id;
        pAVar7 = Aig_ObjChild0Copy(pAVar5);
        Vec_PtrWriteEntry(p_01,iVar1,pAVar7);
        iVar1 = pAVar4->Id;
        pAVar7 = Aig_ObjChild0Copy(pAVar5);
        Vec_PtrWriteEntry(p_02,iVar1,pAVar7);
        pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
        pAVar7 = Aig_ObjChild0Copy(pAVar5);
        pAVar4 = Aig_Exor(p_00,pAVar4,pAVar7);
        pAVar4 = Aig_And(p_00,pAVar4,pAVar6);
        pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
        (pAVar5->field_5).pData = pAVar4;
        pAVar9 = p->pAig;
        iVar1 = pAVar9->nRegs;
      }
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_02);
    }
    Aig_ManCleanup(p_00);
    Aig_ManSetCioIds(p_00);
    return p_00;
  }
  __assert_fail("Aig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                ,0x110,"Aig_Man_t *Cgt_ManDeriveAigForGating(Cgt_Man_t *)");
}

Assistant:

Aig_Man_t * Cgt_ManDeriveAigForGating( Cgt_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pCare, * pMiter;
    Vec_Ptr_t * vCopy0, * vCopy1;
    int i;
    assert( Aig_ManRegNum(p->pAig) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    pNew->pName = Abc_UtilStrsav( "CG_miter" );
    // build the first frame
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p->pAig, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->nOdcMax > 0 )
    {
        // create storage for observability conditions
        vCopy0 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        vCopy1 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        // initialize register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
        }
        // compute observability condition for each latch output
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            // set the constants
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ManConst0(pNew) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ManConst1(pNew) );
            // compute condition
            pCare = Cgt_ManConstructCareCondition( p, pNew, pObjLo, vCopy0, vCopy1 );
            // restore the values
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            // compute the miter
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pMiter = Aig_And( pNew, pMiter, pCare );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
        Vec_PtrFree( vCopy0 );
        Vec_PtrFree( vCopy1 );
    }
    else
    {
        // construct clock-gating miters for each register input
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetCioIds( pNew );
    return pNew;
}